

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void SobelToPlaneRow_SSE2(uint8_t *src_sobelx,uint8_t *src_sobely,uint8_t *dst_y,int width)

{
  undefined1 (*pauVar1) [16];
  bool bVar2;
  int iVar3;
  long lVar4;
  undefined1 auVar5 [16];
  
  lVar4 = (long)src_sobely - (long)src_sobelx;
  do {
    auVar5 = *(undefined1 (*) [16])src_sobelx;
    pauVar1 = (undefined1 (*) [16])((long)src_sobelx + lVar4);
    src_sobelx = (uint8_t *)((long)src_sobelx + 0x10);
    auVar5 = paddusb(auVar5,*pauVar1);
    *(undefined1 (*) [16])dst_y = auVar5;
    dst_y = (uint8_t *)((long)dst_y + 0x10);
    iVar3 = width + -0x10;
    bVar2 = 0xf < width;
    width = iVar3;
  } while (iVar3 != 0 && bVar2);
  return;
}

Assistant:

void SobelToPlaneRow_SSE2(const uint8_t* src_sobelx,
                          const uint8_t* src_sobely,
                          uint8_t* dst_y,
                          int width) {
  asm volatile(
      "sub         %0,%1                         \n"
      "pcmpeqb     %%xmm5,%%xmm5                 \n"
      "pslld       $0x18,%%xmm5                  \n"

      // 8 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x00(%0,%1,1),%%xmm1          \n"
      "lea         0x10(%0),%0                   \n"
      "paddusb     %%xmm1,%%xmm0                 \n"
      "movdqu      %%xmm0,(%2)                   \n"
      "lea         0x10(%2),%2                   \n"
      "sub         $0x10,%3                      \n"
      "jg          1b                            \n"
      : "+r"(src_sobelx),  // %0
        "+r"(src_sobely),  // %1
        "+r"(dst_y),       // %2
        "+r"(width)        // %3
      :
      : "memory", "cc", "xmm0", "xmm1");
}